

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall
despot::Parser::IsInTerminalStateSet(Parser *this,vector<int,_std::allocator<int>_> *state)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  const_reference pvVar4;
  _Self local_70;
  _Self local_68 [3];
  int local_50;
  int local_4c;
  int id;
  int i_1;
  vector<int,_std::allocator<int>_> val;
  TerminalPattern *pattern;
  int i;
  vector<int,_std::allocator<int>_> *state_local;
  Parser *this_local;
  
  for (pattern._4_4_ = 0;
      sVar2 = std::vector<despot::TerminalPattern,_std::allocator<despot::TerminalPattern>_>::size
                        (&this->terminal_state_patterns_), (ulong)(long)pattern._4_4_ < sVar2;
      pattern._4_4_ = pattern._4_4_ + 1) {
    val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::vector<despot::TerminalPattern,_std::allocator<despot::TerminalPattern>_>::
                  operator[](&this->terminal_state_patterns_,(long)pattern._4_4_);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&id);
    for (local_4c = 0; uVar3 = (ulong)local_4c,
        sVar2 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage), uVar3 < sVar2;
        local_4c = local_4c + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)local_4c);
      local_50 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](state,(long)local_50);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&id,pvVar4);
    }
    local_68[0]._M_node =
         (_Base_ptr)
         std::
         set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::find((set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)(val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 6),(key_type *)&id);
    local_70._M_node =
         (_Base_ptr)
         std::
         set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::end((set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)(val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_end_of_storage + 6));
    bVar1 = std::operator!=(local_68,&local_70);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&id);
    if (bVar1) goto LAB_001edb2e;
  }
  this_local._7_1_ = 0;
LAB_001edb2e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::IsInTerminalStateSet(const vector<int>& state) const {
	for (int i = 0; i < terminal_state_patterns_.size(); i++) {
		const TerminalPattern& pattern = terminal_state_patterns_[i];
		vector<int> val;
		for (int i = 0; i < pattern.state_ids.size(); i++) {
			int id = pattern.state_ids[i];
			val.push_back(state[id]);
		}
		if (pattern.state_vals.find(val) != pattern.state_vals.end()) {
			return true;
		}
	}
	return false;
}